

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCore.c
# Opt level: O0

int ZPdr_ManSimpleMic(Pdr_Man_t *p,int k,Pdr_Set_t **ppCube)

{
  int iRemove;
  undefined4 uVar1;
  Pdr_Set_t *pSet;
  int iVar2;
  Pdr_Set_t *pPVar3;
  Pdr_Set_t *pCubeTmp;
  int RetValue;
  int Lit;
  int j;
  int i;
  int *pOrder;
  Pdr_Set_t **ppCube_local;
  int k_local;
  Pdr_Man_t *p_local;
  
  if (p->pPars->fSkipGeneral == 0) {
    _j = Pdr_ManSortByPriority(p,*ppCube);
    for (RetValue = 0; RetValue < (*ppCube)->nLits; RetValue = RetValue + 1) {
      iRemove = _j[RetValue];
      if (*(int *)(&(*ppCube)->field_0x14 + (long)iRemove * 4) == -1) {
        __assert_fail("(*ppCube)->Lits[i] != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrCore.c"
                      ,0x150,"int ZPdr_ManSimpleMic(Pdr_Man_t *, int, Pdr_Set_t **)");
      }
      iVar2 = Pdr_SetIsInit(*ppCube,iRemove);
      if (iVar2 == 0) {
        uVar1 = *(undefined4 *)(&(*ppCube)->field_0x14 + (long)iRemove * 4);
        *(undefined4 *)(&(*ppCube)->field_0x14 + (long)iRemove * 4) = 0xffffffff;
        iVar2 = Pdr_ManCheckCube(p,k,*ppCube,(Pdr_Set_t **)0x0,p->pPars->nConfLimit,0,1);
        if (iVar2 == -1) {
          return -1;
        }
        *(undefined4 *)(&(*ppCube)->field_0x14 + (long)iRemove * 4) = uVar1;
        if (iVar2 != 0) {
          pSet = *ppCube;
          pPVar3 = Pdr_SetCreateFrom(pSet,iRemove);
          *ppCube = pPVar3;
          Pdr_SetDeref(pSet);
          if ((*ppCube)->nLits < 1) {
            __assert_fail("(*ppCube)->nLits > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrCore.c"
                          ,0x160,"int ZPdr_ManSimpleMic(Pdr_Man_t *, int, Pdr_Set_t **)");
          }
          _j = Pdr_ManSortByPriority(p,*ppCube);
          RetValue = RetValue + -1;
        }
      }
    }
  }
  return 0;
}

Assistant:

int ZPdr_ManSimpleMic( Pdr_Man_t * p, int k, Pdr_Set_t ** ppCube )
{
    int * pOrder;
    int i, j, Lit, RetValue;
    Pdr_Set_t * pCubeTmp;
    // perform generalization
    if ( p->pPars->fSkipGeneral )
      return 0;

    // sort literals by their occurences
    pOrder = Pdr_ManSortByPriority( p, *ppCube );
    // try removing literals
    for ( j = 0; j < (*ppCube)->nLits; j++ )
    {
        // use ordering
    //        i = j;
        i = pOrder[j];

        assert( (*ppCube)->Lits[i] != -1 );
        // check init state
        if ( Pdr_SetIsInit(*ppCube, i) )
            continue;
        // try removing this literal
        Lit = (*ppCube)->Lits[i]; (*ppCube)->Lits[i] = -1; 
        RetValue = Pdr_ManCheckCube( p, k, *ppCube, NULL, p->pPars->nConfLimit, 0, 1 );
        if ( RetValue == -1 )
            return -1;
        (*ppCube)->Lits[i] = Lit;
        if ( RetValue == 0 )
            continue;

        // success - update the cube
        *ppCube = Pdr_SetCreateFrom( pCubeTmp = *ppCube, i );
        Pdr_SetDeref( pCubeTmp );
        assert( (*ppCube)->nLits > 0 );

        // get the ordering by decreasing priority
        pOrder = Pdr_ManSortByPriority( p, *ppCube );
        j--;
    }
    return 0;
}